

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProjectSettings.cpp
# Opt level: O0

Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
ProjectSettings::readFromFile_abi_cxx11_
          (Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ProjectSettings *this,char *filename)

{
  undefined1 auVar1 [16];
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  reference_wrapper *prVar4;
  reference_wrapper<const_yaml::Mapping> *this_00;
  Mapping *pMVar5;
  long *plVar6;
  long lVar7;
  string *psVar8;
  ulong uVar9;
  path *__lhs;
  char *__filename;
  FILE *__stream;
  size_t sVar10;
  undefined8 uVar11;
  char *filename_00;
  allocator<char> local_9c1;
  string local_9c0;
  undefined1 local_9a0 [8];
  ExpectedRef<const_std::string,_std::string> shader_suffix;
  string local_970;
  undefined1 local_950 [8];
  ExpectedRef<const_std::string,_std::string> shader_path;
  string local_920;
  undefined1 local_900 [8];
  ExpectedRef<const_std::string,_std::string> c_source;
  string local_8d0;
  undefined1 local_8b0 [8];
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  height;
  string local_880;
  undefined1 local_860 [8];
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  width;
  Mapping *exports;
  string local_828;
  undefined1 local_808 [8];
  ExpectedRef<const_Mapping,_std::string> map_export;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_780;
  allocator<char> local_759;
  string local_758;
  undefined1 local_738 [8];
  ExpectedRef<const_std::string,_std::string> filename_1;
  string *ytype;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  undefined1 local_6a0 [8];
  ExpectedRef<const_std::string,_std::string> type;
  Mapping *yautomation;
  string local_668;
  undefined1 local_648 [8];
  ExpectedRef<const_Mapping,_std::string> automation;
  undefined1 local_618 [4];
  int samples_read;
  path local_5d8;
  path local_598;
  string local_558;
  FILE *local_538;
  FILE *f;
  string local_528;
  allocator<char> local_501;
  string local_500;
  undefined1 local_4e0 [8];
  string raw_file;
  string local_4b8;
  int local_498;
  allocator<char> local_491;
  int rows_per_beat;
  int local_470;
  allocator<char> local_469;
  int bpm;
  int local_448;
  allocator<char> local_441;
  int duration_sec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  allocator<char> local_3d9;
  string local_3d8;
  undefined1 local_3b8 [8];
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  samplerate_result;
  Mapping *yaudio;
  allocator<char> local_361;
  string local_360;
  undefined1 local_340 [8];
  ExpectedRef<const_Mapping,_std::string> map_audio_result;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  undefined1 local_2b0 [8];
  ExpectedRef<const_std::string,_std::string> video_config_result;
  allocator<char> local_261;
  string local_260;
  undefined1 local_240 [8];
  ExpectedRef<const_Mapping,_std::string> map_video_result;
  ProjectSettings settings;
  Mapping *config;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  undefined1 local_f8 [8];
  ExpectedRef<const_Mapping,_std::string> config_result;
  Value *top;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined1 local_90 [8];
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  top_result;
  char *filename_local;
  
  top_result._112_8_ = this;
  aAppDebugPrintf("Reading project settings from file %s",this);
  yaml::parse_abi_cxx11_
            ((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_90,(yaml *)top_result._112_8_,filename_00);
  bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_90);
  if (!bVar2) {
    pbVar3 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_90);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_c0,pbVar3);
    Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_c0);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_c0);
    goto LAB_00148346;
  }
  config_result._32_8_ =
       Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::value((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_90);
  yaml::Value::getMapping_abi_cxx11_
            ((ExpectedRef<const_Mapping,_std::string> *)local_f8,(Value *)config_result._32_8_);
  bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_f8);
  if (bVar2) {
    prVar4 = (reference_wrapper *)
             Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_f8);
    settings.exports.shader_suffix.field_2._8_8_ =
         std::reference_wrapper::operator_cast_to_Mapping_(prVar4);
    ProjectSettings((ProjectSettings *)&map_video_result.has_value_);
    uVar11 = settings.exports.shader_suffix.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"video",&local_261);
    yaml::Mapping::getMapping
              ((ExpectedRef<const_Mapping,_std::string> *)local_240,(Mapping *)uVar11,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_240);
    if (bVar2) {
      this_00 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_240);
      pMVar5 = std::reference_wrapper<const_yaml::Mapping>::get(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"config_file",&local_2d1);
      yaml::Mapping::getString
                ((ExpectedRef<const_std::string,_std::string> *)local_2b0,pMVar5,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
      bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_2b0);
      if (bVar2) {
        prVar4 = (reference_wrapper *)
                 Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2b0);
        pbVar3 = std::reference_wrapper::operator_cast_to_string_(prVar4);
        std::__cxx11::string::operator=((string *)&map_video_result.has_value_,(string *)pbVar3);
        uVar11 = settings.exports.shader_suffix.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"audio",&local_361);
        yaml::Mapping::getMapping
                  ((ExpectedRef<const_Mapping,_std::string> *)local_340,(Mapping *)uVar11,&local_360
                  );
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator(&local_361);
        bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_340);
        if (bVar2) {
          prVar4 = (reference_wrapper *)
                   Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_340);
          pMVar5 = std::reference_wrapper::operator_cast_to_Mapping_(prVar4);
          samplerate_result._32_8_ = pMVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,"samplerate",&local_3d9);
          yaml::Mapping::getInt
                    ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_3b8,pMVar5,&local_3d8);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::allocator<char>::~allocator(&local_3d9);
          bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_3b8);
          if (bVar2) {
            plVar6 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3b8);
            uVar11 = samplerate_result._32_8_;
            settings.video.config_filename.field_2._8_4_ = (undefined4)*plVar6;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&duration_sec,"channels",&local_441);
            lVar7 = yaml::Mapping::getInt((Mapping *)uVar11,(string *)&duration_sec,2);
            settings.video.config_filename.field_2._12_4_ = (undefined4)lVar7;
            std::__cxx11::string::~string((string *)&duration_sec);
            std::allocator<char>::~allocator(&local_441);
            uVar11 = samplerate_result._32_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&bpm,"duration_sec",&local_469);
            lVar7 = yaml::Mapping::getInt((Mapping *)uVar11,(string *)&bpm,0x78);
            std::__cxx11::string::~string((string *)&bpm);
            std::allocator<char>::~allocator(&local_469);
            uVar11 = samplerate_result._32_8_;
            local_448 = (int)lVar7;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rows_per_beat,"bpm",&local_491);
            lVar7 = yaml::Mapping::getInt((Mapping *)uVar11,(string *)&rows_per_beat,0x3c);
            std::__cxx11::string::~string((string *)&rows_per_beat);
            std::allocator<char>::~allocator(&local_491);
            uVar11 = samplerate_result._32_8_;
            local_470 = (int)lVar7;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4b8,"rows_per_beat",
                       (allocator<char> *)(raw_file.field_2._M_local_buf + 0xf));
            lVar7 = yaml::Mapping::getInt((Mapping *)uVar11,&local_4b8,8);
            std::__cxx11::string::~string((string *)&local_4b8);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(raw_file.field_2._M_local_buf + 0xf));
            uVar11 = samplerate_result._32_8_;
            local_498 = (int)lVar7;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_500,"raw_file",&local_501);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_528,"",(allocator<char> *)((long)&f + 7));
            psVar8 = yaml::Mapping::getString((Mapping *)uVar11,&local_500,&local_528);
            std::__cxx11::string::string((string *)local_4e0,(string *)psVar8);
            std::__cxx11::string::~string((string *)&local_528);
            std::allocator<char>::~allocator((allocator<char> *)((long)&f + 7));
            std::__cxx11::string::~string((string *)&local_500);
            std::allocator<char>::~allocator(&local_501);
            settings.audio.channels =
                 (settings.video.config_filename.field_2._8_4_ * 0x3c) / (local_470 * local_498);
            settings.audio.samplerate = 0;
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              std::experimental::filesystem::v1::__cxx11::path::
              path<char_const*,std::experimental::filesystem::v1::__cxx11::path>
                        (&local_5d8,(char **)&top_result.has_value_);
              __lhs = (path *)std::experimental::filesystem::v1::__cxx11::path::remove_filename
                                        (&local_5d8);
              std::experimental::filesystem::v1::__cxx11::path::
              path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                        ((path *)local_618,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e0);
              std::experimental::filesystem::v1::__cxx11::operator/
                        (&local_598,__lhs,(path *)local_618);
              std::experimental::filesystem::v1::__cxx11::path::string(&local_558,&local_598);
              __filename = (char *)std::__cxx11::string::c_str();
              __stream = fopen(__filename,"rb");
              std::__cxx11::string::~string((string *)&local_558);
              std::experimental::filesystem::v1::__cxx11::path::~path(&local_598);
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_618);
              std::experimental::filesystem::v1::__cxx11::path::~path(&local_5d8);
              local_538 = __stream;
              if (__stream != (FILE *)0x0) {
                fseek(__stream,0,2);
                uVar9 = ftell(local_538);
                settings.audio.samplerate =
                     (int)(uVar9 / (ulong)((long)(int)settings.video.config_filename.field_2._12_4_
                                          << 2));
                fseek(local_538,0,0);
                auVar1._8_8_ = 0;
                auVar1._0_8_ = (long)(settings.audio.samplerate * 2);
                uVar9 = SUB168(auVar1 * ZEXT816(4),0);
                if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
                  uVar9 = 0xffffffffffffffff;
                }
                settings.audio._16_8_ = operator_new__(uVar9);
                sVar10 = fread((void *)settings.audio._16_8_,
                               (long)(int)settings.video.config_filename.field_2._12_4_ << 2,
                               (long)settings.audio.samplerate,local_538);
                automation._36_4_ = SUB84(sVar10,0);
                if ((settings.audio.samplerate != automation._36_4_) ||
                   (settings.audio.samplerate == 0)) {
                  if (settings.audio._16_8_ != 0) {
                    operator_delete__((void *)settings.audio._16_8_);
                  }
                  settings.audio.pattern_length = 0;
                  settings.audio._20_4_ = 0;
                }
                fclose(local_538);
              }
            }
            if (settings.audio._16_8_ == 0) {
              aAppDebugPrintf("No raw audio available, continuing in silence");
              settings.audio.samplerate = settings.video.config_filename.field_2._8_4_ * local_448;
            }
            uVar11 = settings.exports.shader_suffix.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_668,"automation",(allocator<char> *)((long)&yautomation + 7)
                      );
            yaml::Mapping::getMapping
                      ((ExpectedRef<const_Mapping,_std::string> *)local_648,(Mapping *)uVar11,
                       &local_668);
            std::__cxx11::string::~string((string *)&local_668);
            std::allocator<char>::~allocator((allocator<char> *)((long)&yautomation + 7));
            bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_648);
            if (bVar2) {
              prVar4 = (reference_wrapper *)
                       Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_648);
              pMVar5 = std::reference_wrapper::operator_cast_to_Mapping_(prVar4);
              type._32_8_ = pMVar5;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6c0,"type",&local_6c1);
              yaml::Mapping::getString
                        ((ExpectedRef<const_std::string,_std::string> *)local_6a0,pMVar5,&local_6c0)
              ;
              std::__cxx11::string::~string((string *)&local_6c0);
              std::allocator<char>::~allocator(&local_6c1);
              bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_6a0);
              if (!bVar2) {
                pbVar3 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_6a0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ytype,"Cannot read automation: ",pbVar3);
                Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Unexpected(&local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ytype);
                Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Expected(__return_storage_ptr__,&local_6e8);
                Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Unexpected(&local_6e8);
                std::__cxx11::string::~string((string *)&ytype);
                bVar2 = true;
                goto LAB_00147976;
              }
              prVar4 = (reference_wrapper *)
                       Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_6a0);
              filename_1._32_8_ = std::reference_wrapper::operator_cast_to_string_(prVar4);
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)filename_1._32_8_,"Rocket");
              if (bVar2) {
                settings.audio.data._0_4_ = 2;
LAB_0014796c:
                bVar2 = false;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)filename_1._32_8_,"Gui");
                if (bVar2) {
                  settings.audio.data._0_4_ = 3;
                  goto LAB_0014796c;
                }
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)filename_1._32_8_,"Basic");
                uVar11 = type._32_8_;
                if (bVar2) {
                  settings.audio.data._0_4_ = 1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_758,"file",&local_759);
                  yaml::Mapping::getString
                            ((ExpectedRef<const_std::string,_std::string> *)local_738,
                             (Mapping *)uVar11,&local_758);
                  std::__cxx11::string::~string((string *)&local_758);
                  std::allocator<char>::~allocator(&local_759);
                  bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_738);
                  if (bVar2) {
                    prVar4 = (reference_wrapper *)
                             Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_738);
                    pbVar3 = std::reference_wrapper::operator_cast_to_string_(prVar4);
                    std::__cxx11::string::operator=((string *)&settings.automation,(string *)pbVar3)
                    ;
                  }
                  else {
                    pbVar3 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_738);
                    std::operator+(&local_7a0,"Cannot read basic automation file: ",pbVar3);
                    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Unexpected(&local_780,&local_7a0);
                    Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Expected(__return_storage_ptr__,&local_780);
                    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~Unexpected(&local_780);
                    std::__cxx11::string::~string((string *)&local_7a0);
                  }
                  bVar2 = !bVar2;
                  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_738);
                  if (!bVar2) goto LAB_0014796c;
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)filename_1._32_8_,"None");
                  if (bVar2) goto LAB_0014796c;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&map_export.has_value_,"Unexpected automation type ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)filename_1._32_8_);
                  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Unexpected(&local_7c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &map_export.has_value_);
                  Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Expected(__return_storage_ptr__,&local_7c0);
                  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~Unexpected(&local_7c0);
                  std::__cxx11::string::~string((string *)&map_export.has_value_);
                  bVar2 = true;
                }
              }
LAB_00147976:
              Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_6a0);
              if (!bVar2) goto LAB_001479a1;
            }
            else {
LAB_001479a1:
              bVar2 = false;
            }
            Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_648);
            uVar11 = settings.exports.shader_suffix.field_2._8_8_;
            if (!bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_828,"export",(allocator<char> *)((long)&exports + 7));
              yaml::Mapping::getMapping
                        ((ExpectedRef<const_Mapping,_std::string> *)local_808,(Mapping *)uVar11,
                         &local_828);
              std::__cxx11::string::~string((string *)&local_828);
              std::allocator<char>::~allocator((allocator<char> *)((long)&exports + 7));
              bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_808);
              if (bVar2) {
                prVar4 = (reference_wrapper *)
                         Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_808);
                pMVar5 = std::reference_wrapper::operator_cast_to_Mapping_(prVar4);
                width._32_8_ = pMVar5;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_880,"width",(allocator<char> *)&height.field_0x27);
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_860,pMVar5,&local_880);
                std::__cxx11::string::~string((string *)&local_880);
                std::allocator<char>::~allocator((allocator<char> *)&height.field_0x27);
                bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_860);
                if (bVar2) {
                  plVar6 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_860);
                  settings.automation.filename.field_2._8_4_ = (undefined4)*plVar6;
                }
                else {
                  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_860);
                  uVar11 = std::__cxx11::string::c_str();
                  aAppDebugPrintf("Cannot read export.width: %s. Continuing with default",uVar11);
                }
                Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_860);
                uVar11 = width._32_8_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_8d0,"height",(allocator<char> *)&c_source.field_0x27);
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_8b0,(Mapping *)uVar11,&local_8d0);
                std::__cxx11::string::~string((string *)&local_8d0);
                std::allocator<char>::~allocator((allocator<char> *)&c_source.field_0x27);
                bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_8b0);
                if (bVar2) {
                  plVar6 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_8b0);
                  settings.automation.filename.field_2._12_4_ = (undefined4)*plVar6;
                }
                else {
                  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_8b0);
                  uVar11 = std::__cxx11::string::c_str();
                  aAppDebugPrintf("Cannot read export.height: %s. Continuing with default",uVar11);
                }
                Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_8b0);
                uVar11 = width._32_8_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_920,"c_source",
                           (allocator<char> *)&shader_path.field_0x27);
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_900,
                           (Mapping *)uVar11,&local_920);
                std::__cxx11::string::~string((string *)&local_920);
                std::allocator<char>::~allocator((allocator<char> *)&shader_path.field_0x27);
                bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_900);
                if (bVar2) {
                  prVar4 = (reference_wrapper *)
                           Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_900);
                  pbVar3 = std::reference_wrapper::operator_cast_to_string_(prVar4);
                  std::__cxx11::string::operator=((string *)&settings.exports,(string *)pbVar3);
                }
                else {
                  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_900);
                  uVar11 = std::__cxx11::string::c_str();
                  aAppDebugPrintf("Cannot read export.c_source: %s. Continuing with default",uVar11)
                  ;
                }
                Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_900);
                uVar11 = width._32_8_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_970,"shader_path",
                           (allocator<char> *)&shader_suffix.field_0x27);
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_950,
                           (Mapping *)uVar11,&local_970);
                std::__cxx11::string::~string((string *)&local_970);
                std::allocator<char>::~allocator((allocator<char> *)&shader_suffix.field_0x27);
                bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_950);
                if (bVar2) {
                  prVar4 = (reference_wrapper *)
                           Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_950);
                  pbVar3 = std::reference_wrapper::operator_cast_to_string_(prVar4);
                  std::__cxx11::string::operator=
                            ((string *)(settings.exports.c_source.field_2._M_local_buf + 8),
                             (string *)pbVar3);
                }
                else {
                  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_950);
                  uVar11 = std::__cxx11::string::c_str();
                  aAppDebugPrintf("Cannot read export.shader_path: %s. Continuing with default",
                                  uVar11);
                }
                Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_950);
                uVar11 = width._32_8_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_9c0,"shader_suffix",&local_9c1);
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_9a0,
                           (Mapping *)uVar11,&local_9c0);
                std::__cxx11::string::~string((string *)&local_9c0);
                std::allocator<char>::~allocator(&local_9c1);
                bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_9a0);
                if (bVar2) {
                  prVar4 = (reference_wrapper *)
                           Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_9a0);
                  pbVar3 = std::reference_wrapper::operator_cast_to_string_(prVar4);
                  std::__cxx11::string::operator=
                            ((string *)(settings.exports.shader_path.field_2._M_local_buf + 8),
                             (string *)pbVar3);
                }
                else {
                  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_9a0);
                  uVar11 = std::__cxx11::string::c_str();
                  aAppDebugPrintf("Cannot read export.shader_suffix: %s. Continuing with default",
                                  uVar11);
                }
                Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_9a0);
              }
              else {
                Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::error((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_808);
                uVar11 = std::__cxx11::string::c_str();
                aAppDebugPrintf("Cannot read export section: %s. Continuing with defaults",uVar11);
              }
              Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_808);
              Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,(ProjectSettings *)&map_video_result.has_value_);
            }
            std::__cxx11::string::~string((string *)local_4e0);
          }
          else {
            pbVar3 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3b8);
            std::operator+(&local_420,"Error reading samplerate: ",pbVar3);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Unexpected(&local_400,&local_420);
            Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,&local_400);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Unexpected(&local_400);
            std::__cxx11::string::~string((string *)&local_420);
          }
          Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_3b8);
        }
        else {
          pbVar3 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::error((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_340);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&yaudio,pbVar3);
          Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,(UnexpectedType *)&yaudio);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&yaudio);
        }
        Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_340);
      }
      else {
        pbVar3 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &map_audio_result.has_value_,"Cannot read video config: ",pbVar3);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &map_audio_result.has_value_);
        Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_2f8);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_2f8);
        std::__cxx11::string::~string((string *)&map_audio_result.has_value_);
      }
      Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_2b0);
    }
    else {
      pbVar3 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_240);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&video_config_result.has_value_,pbVar3);
      Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,(UnexpectedType *)&video_config_result.has_value_);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&video_config_result.has_value_);
    }
    Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_240);
    ~ProjectSettings((ProjectSettings *)&map_video_result.has_value_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Top config entity is not an ojbect",
               (allocator<char> *)((long)&config + 7));
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_118,&local_138);
    Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_118);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&config + 7));
  }
  Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_f8);
LAB_00148346:
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Expected<ProjectSettings, std::string> ProjectSettings::readFromFile(const char *filename) {
	MSG("Reading project settings from file %s", filename);

	const auto top_result = yaml::parse(filename);
	if (!top_result)
		return Unexpected(top_result.error());

	const yaml::Value &top = top_result.value();
	const auto config_result = top.getMapping();
	if (!config_result)
		return Unexpected<std::string>("Top config entity is not an ojbect");
	const yaml::Mapping &config = config_result.value();

	ProjectSettings settings;
	auto map_video_result = config.getMapping("video");
	if (!map_video_result)
		return Unexpected(map_video_result.error());
	auto video_config_result = map_video_result.value().get().getString("config_file");
	if (!video_config_result)
		return Unexpected("Cannot read video config: " + video_config_result.error());
	settings.video.config_filename = video_config_result.value();

	auto map_audio_result = config.getMapping("audio");
	if (!map_audio_result)
		return Unexpected(map_audio_result.error());
	const yaml::Mapping &yaudio = map_audio_result.value();
	auto samplerate_result = yaudio.getInt("samplerate");
	if (!samplerate_result)
		return Unexpected("Error reading samplerate: " + samplerate_result.error());
	settings.audio.samplerate = samplerate_result.value();
	settings.audio.channels = yaudio.getInt("channels", 2);

	const int duration_sec = yaudio.getInt("duration_sec", 120);
	const int bpm = yaudio.getInt("bpm", 60);
	const int rows_per_beat = yaudio.getInt("rows_per_beat", 8);
	const std::string raw_file = yaudio.getString("raw_file", "");

	settings.audio.samples_per_row = settings.audio.samplerate * 60 / (bpm * rows_per_beat);
	settings.audio.samples = 0;

	if (!raw_file.empty()) {
		FILE *f = fopen((fs::path(filename).remove_filename()/raw_file).string().c_str(), "rb");
		if (f) {
			fseek(f, 0L, SEEK_END);
			settings.audio.samples = ftell(f) / (sizeof(float) * settings.audio.channels);
			fseek(f, 0L, SEEK_SET);
			settings.audio.data = new float[settings.audio.samples * 2];
			const int samples_read = fread(settings.audio.data, sizeof(float) * settings.audio.channels, settings.audio.samples, f);
			if (settings.audio.samples != samples_read || !settings.audio.samples) {
				delete[] settings.audio.data;
				settings.audio.data = nullptr;
			}
			fclose(f);
		}
	}

	if (!settings.audio.data) {
		MSG("No raw audio available, continuing in silence");
		settings.audio.samples = settings.audio.samplerate * duration_sec;
	}

	if (auto automation = config.getMapping("automation")) {
		const yaml::Mapping &yautomation = automation.value();
		auto type = yautomation.getString("type");
		if (!type)
			return Unexpected("Cannot read automation: " + type.error());
		const std::string &ytype = type.value();
		if (ytype == "Rocket")
			settings.automation.type = Automation::Type::Rocket;
		else if (ytype == "Gui")
			settings.automation.type = Automation::Type::Gui;
		else if (ytype == "Basic") {
			settings.automation.type = Automation::Type::Basic;
			auto filename = yautomation.getString("file");
			if (!filename)
				return Unexpected("Cannot read basic automation file: " + filename.error());
			settings.automation.filename = filename.value();
		} else if (ytype == "None") {
		} else
			return Unexpected("Unexpected automation type " + ytype);
	}

	if (auto map_export = config.getMapping("export")) {
		const yaml::Mapping &exports = map_export.value();
	#define READ_VALUE(name, getType) \
		if (auto name = exports.getType(#name)) \
			settings.exports.name = name.value(); \
		else \
			MSG("Cannot read export." #name ": %s. Continuing with default", name.error().c_str())

		READ_VALUE(width, getInt);
		READ_VALUE(height, getInt);
		READ_VALUE(c_source, getString);
		READ_VALUE(shader_path, getString);
		READ_VALUE(shader_suffix, getString);
		//READ_VALUE(shader_concat, getInt);
	} else {
		MSG("Cannot read export section: %s. Continuing with defaults", map_export.error().c_str());
	}

	return settings;
}